

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_extensions.cpp
# Opt level: O0

void duckdb::DuckDBExtensionsFun::RegisterFunction(BuiltinFunctions *set)

{
  TableFunctionSet *in_RDI;
  TableFunctionSet functions;
  TableFunction *in_stack_fffffffffffffd68;
  TableFunction *this;
  string *in_stack_fffffffffffffda8;
  TableFunctionSet *in_stack_fffffffffffffdb0;
  _func_int **init_local;
  table_function_init_global_t init_global;
  table_function_bind_t bind;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  TableFunction *in_stack_fffffffffffffde0;
  allocator local_61;
  string local_60 [56];
  TableFunctionSet *in_stack_ffffffffffffffd8;
  BuiltinFunctions *in_stack_ffffffffffffffe0;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_60,"duckdb_extensions",&local_61);
  TableFunctionSet::TableFunctionSet(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  ::std::__cxx11::string::~string(local_60);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
  init_local = (_func_int **)0x0;
  init_global = (table_function_init_global_t)0x0;
  bind = (table_function_bind_t)0x0;
  this = (TableFunction *)&stack0xfffffffffffffdb8;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x1409b3d);
  TableFunction::TableFunction
            (in_stack_fffffffffffffde0,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffdd8,
             (table_function_t)in_stack_fffffffffffffdd0,bind,init_global,
             (table_function_init_local_t)init_local);
  FunctionSet<duckdb::TableFunction>::AddFunction
            ((FunctionSet<duckdb::TableFunction> *)this,in_stack_fffffffffffffd68);
  TableFunction::~TableFunction(this);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1409b90);
  TableFunctionSet::TableFunctionSet((TableFunctionSet *)this,in_RDI);
  BuiltinFunctions::AddFunction(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TableFunctionSet::~TableFunctionSet((TableFunctionSet *)0x1409bca);
  TableFunctionSet::~TableFunctionSet((TableFunctionSet *)0x1409bd7);
  return;
}

Assistant:

void DuckDBExtensionsFun::RegisterFunction(BuiltinFunctions &set) {
	TableFunctionSet functions("duckdb_extensions");
	functions.AddFunction(TableFunction({}, DuckDBExtensionsFunction, DuckDBExtensionsBind, DuckDBExtensionsInit));
	set.AddFunction(functions);
}